

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Schema type,
          CppTypeName *name)

{
  Scope *pSVar1;
  Initializer *pIVar2;
  char *pcVar3;
  char *pcVar4;
  RawSchema *params_1;
  RawSchema *pRVar5;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *extraout_RDX_02;
  CppTypeName *value;
  ArrayPtr<const_char> *in_R8;
  StringPtr innerName;
  StringTree local_80;
  char *local_48;
  char *pcStack_40;
  undefined8 *local_38;
  char *local_30;
  Branch *local_28;
  
  if ((CapnpcCppMain *)(this->context + 9) == this) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    innerName.content.size_ = 0xe;
    innerName.content.ptr = "_capnpPrivate";
    CppTypeName::addMemberType((CppTypeName *)type.raw,innerName);
    local_48 = "::";
    pcStack_40 = (char *)0x2;
    params_1 = (RawSchema *)&stack0xffffffffffffffd0;
    local_30 = "brand";
    local_28 = (Branch *)0x5;
    kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_80,(StringTree *)type.raw,(StringTree *)&local_48,
               (ArrayPtr<const_char> *)params_1,in_R8);
    (type.raw)->generic = (RawSchema *)local_80.size_;
    pSVar1 = (type.raw)->scopes;
    value = extraout_RDX;
    if (pSVar1 != (Scope *)0x0) {
      params_1 = (RawSchema *)(type.raw)->dependencies;
      (type.raw)->scopes = (Scope *)0x0;
      (type.raw)->dependencies = (Dependency *)0x0;
      (**(code **)**(undefined8 **)&(type.raw)->scopeCount)
                (*(undefined8 **)&(type.raw)->scopeCount,pSVar1,1,params_1,params_1,0);
      value = extraout_RDX_00;
    }
    (type.raw)->scopes = (Scope *)local_80.text.content.ptr;
    (type.raw)->dependencies = (Dependency *)local_80.text.content.size_;
    *(ArrayDisposer **)&(type.raw)->scopeCount = local_80.text.content.disposer;
    local_80.text.content.ptr = (char *)0x0;
    local_80.text.content.size_ = 0;
    pIVar2 = (type.raw)->lazyInitializer;
    if (pIVar2 != (Initializer *)0x0) {
      params_1 = type.raw[1].generic;
      (type.raw)->lazyInitializer = (Initializer *)0x0;
      type.raw[1].generic = (RawSchema *)0x0;
      (**(code **)(type.raw[1].scopes)->typeId)
                (type.raw[1].scopes,pIVar2,0x40,params_1,params_1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      value = extraout_RDX_01;
    }
    pRVar5 = (RawSchema *)local_80.text.content.size_;
    pcVar3 = local_80.text.content.ptr;
    (type.raw)->lazyInitializer = (Initializer *)local_80.branches.ptr;
    type.raw[1].generic = (RawSchema *)local_80.branches.size_;
    type.raw[1].scopes = (Scope *)local_80.branches.disposer;
    local_80.branches.ptr = (Branch *)0x0;
    local_80.branches.size_ = 0;
    if (local_80.text.content.ptr != (char *)0x0) {
      local_80.text.content.ptr = (char *)0x0;
      local_80.text.content.size_ = 0;
      (**(local_80.text.content.disposer)->_vptr_ArrayDisposer)
                (local_80.text.content.disposer,pcVar3,1,pRVar5,pRVar5,0);
      params_1 = pRVar5;
      value = extraout_RDX_02;
    }
    *(undefined1 *)((long)&type.raw[1].dependencies + 1) = 0;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_48,(kj *)type.raw,value);
    local_30 = "()";
    local_28 = (Branch *)0x2;
    kj::StringTree::concat<kj::String,kj::ArrayPtr<char_const>>
              (&local_80,(StringTree *)&local_48,(String *)&stack0xffffffffffffffd0,
               (ArrayPtr<const_char> *)params_1);
    pcVar4 = pcStack_40;
    pcVar3 = local_48;
    if (local_48 != (char *)0x0) {
      local_48 = (char *)0x0;
      pcStack_40 = (char *)0x0;
      (**(code **)*local_38)(local_38,pcVar3,1,pcVar4,pcVar4,0);
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.size_ = local_80.size_;
    (__return_storage_ptr__->ptr).field_1.value.text.content.ptr = local_80.text.content.ptr;
    (__return_storage_ptr__->ptr).field_1.value.text.content.size_ = local_80.text.content.size_;
    (__return_storage_ptr__->ptr).field_1.value.text.content.disposer =
         local_80.text.content.disposer;
    (__return_storage_ptr__->ptr).field_1.value.branches.ptr = local_80.branches.ptr;
    (__return_storage_ptr__->ptr).field_1.value.branches.size_ = local_80.branches.size_;
    (__return_storage_ptr__->ptr).field_1.value.branches.disposer = local_80.branches.disposer;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(Schema type, CppTypeName name) {
    if (type.isBranded()) {
      name.addMemberType("_capnpPrivate");
      name.addMemberValue("brand");
      return kj::strTree(name, "()");
    } else {
      return nullptr;
    }
  }